

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O2

int Res_WinCompute(Abc_Obj_t *pNode,int nWinTfiMax,int nWinTfoMax,Res_Win_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,0x1c5,"int Res_WinCompute(Abc_Obj_t *, int, int, Res_Win_t *)");
  }
  if (nWinTfiMax - 1U < 9) {
    if ((uint)nWinTfoMax < 10) {
      p->pNode = pNode;
      p->nWinTfiMax = nWinTfiMax;
      p->nWinTfoMax = nWinTfoMax;
      p->vBranches->nSize = 0;
      p->vDivs->nSize = 0;
      p_00 = p->vRoots;
      p_00->nSize = 0;
      Vec_PtrPush(p_00,pNode);
      iVar1 = Res_WinCollectLeavesAndNodes(p);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = 1;
        if (0 < p->nWinTfoMax) {
          iVar2 = Res_WinComputeRoots(p);
          if (iVar2 != 0) {
            Res_WinMarkPaths(p);
            iVar2 = Res_WinFinalizeRoots(p);
            if (iVar2 != 0) {
              Res_WinAddMissing(p);
            }
          }
        }
      }
      return iVar1;
    }
    __assert_fail("nWinTfoMax >= 0 && nWinTfoMax < 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,0x1c7,"int Res_WinCompute(Abc_Obj_t *, int, int, Res_Win_t *)");
  }
  __assert_fail("nWinTfiMax > 0 && nWinTfiMax < 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                ,0x1c6,"int Res_WinCompute(Abc_Obj_t *, int, int, Res_Win_t *)");
}

Assistant:

int Res_WinCompute( Abc_Obj_t * pNode, int nWinTfiMax, int nWinTfoMax, Res_Win_t * p )
{
    assert( Abc_ObjIsNode(pNode) );
    assert( nWinTfiMax > 0 && nWinTfiMax < 10 );
    assert( nWinTfoMax >= 0 && nWinTfoMax < 10 );

    // initialize the window
    p->pNode      = pNode;
    p->nWinTfiMax = nWinTfiMax;
    p->nWinTfoMax = nWinTfoMax;

    Vec_PtrClear( p->vBranches );
    Vec_PtrClear( p->vDivs );
    Vec_PtrClear( p->vRoots );
    Vec_PtrPush( p->vRoots, pNode );

    // compute the leaves
    if ( !Res_WinCollectLeavesAndNodes( p ) )
        return 0;

    // compute the candidate roots
    if ( p->nWinTfoMax > 0 && Res_WinComputeRoots(p) )
    {
        // mark the paths from the roots to the leaves
        Res_WinMarkPaths( p );
        // refine the roots and add branches and missing nodes
        if ( Res_WinFinalizeRoots( p ) )
            Res_WinAddMissing( p );
    }

    return 1;
}